

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall
CLIntercept::injectImagesForKernel
          (CLIntercept *this,uint64_t enqueueCounter,cl_kernel kernel,cl_command_queue command_queue
          )

{
  double __x;
  mapped_type *pmVar1;
  void *pvVar2;
  bool bVar3;
  byte bVar4;
  _Ios_Openmode _Var5;
  reference ppVar6;
  mapped_type *pmVar7;
  CLIntercept *pCVar8;
  char *pcVar9;
  vector<char,_std::allocator<char>_> *in_RCX;
  ulong in_RSI;
  CLIntercept *in_RDI;
  float __x_00;
  undefined1 auVar10 [16];
  size_t origin [3];
  size_t size;
  size_t fileSize;
  ifstream is;
  char tmpStr [256];
  string fileName;
  uint number;
  SImageInfo *info;
  cl_mem memobj;
  cl_uint arg_index;
  iterator i;
  CArgMemMap *kernelArgMemMap;
  string prefix;
  vector<char,_std::allocator<char>_> transferBuf;
  lock_guard<std::mutex> lock;
  map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>
  *in_stack_fffffffffffffa88;
  lock_guard<std::mutex> *in_stack_fffffffffffffa90;
  undefined4 in_stack_fffffffffffffa98;
  undefined4 in_stack_fffffffffffffa9c;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffaa0;
  size_type in_stack_fffffffffffffaa8;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffab0;
  key_type *in_stack_fffffffffffffac8;
  cl_icd_dispatch *in_stack_fffffffffffffad0;
  CLIntercept *in_stack_fffffffffffffad8;
  string *in_stack_fffffffffffffae0;
  string *in_stack_fffffffffffffae8;
  undefined7 in_stack_fffffffffffffaf0;
  undefined1 in_stack_fffffffffffffaf7;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  CLIntercept *local_490;
  undefined1 local_488 [16];
  CLIntercept *local_478;
  string local_470 [32];
  string local_450 [32];
  char local_430 [520];
  string local_228 [32];
  char local_208 [256];
  string local_108 [32];
  void *local_e8;
  mapped_type local_dc;
  mapped_type *local_d8;
  _Self local_d0;
  _Self local_c8;
  void *local_c0;
  uint local_b4;
  _Self local_b0;
  _Self local_a8;
  mapped_type *local_a0;
  allocator local_91;
  string local_90 [48];
  string local_60 [32];
  vector<char,_std::allocator<char>_> local_40;
  vector<char,_std::allocator<char>_> *local_20;
  ulong local_10;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  std::lock_guard<std::mutex>::lock_guard
            (in_stack_fffffffffffffa90,(mutex_type *)in_stack_fffffffffffffa88);
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x210f65);
  std::__cxx11::string::string(local_60);
  OS(in_RDI);
  pcVar9 = sc_DumpDirectoryName;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,pcVar9,&local_91);
  ::OS::Services_Common::GetDumpDirectoryNameWithoutPid
            ((Services_Common *)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
             in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::__cxx11::string::operator+=(local_60,"/Inject/");
  local_a0 = std::
             map<_cl_kernel_*,_std::map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_std::map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>_>_>_>
             ::operator[]((map<_cl_kernel_*,_std::map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_std::map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>_>_>_>
                           *)in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
  local_a8._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>
       ::begin(in_stack_fffffffffffffa88);
  while( true ) {
    local_b0._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>
         ::end(in_stack_fffffffffffffa88);
    bVar3 = std::operator!=(&local_a8,&local_b0);
    if (!bVar3) break;
    ppVar6 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_const_void_*>_>::operator*
                       ((_Rb_tree_iterator<std::pair<const_unsigned_int,_const_void_*>_> *)0x2110b1)
    ;
    local_b4 = ppVar6->first;
    ppVar6 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_const_void_*>_>::operator*
                       ((_Rb_tree_iterator<std::pair<const_unsigned_int,_const_void_*>_> *)0x2110c7)
    ;
    local_c0 = ppVar6->second;
    std::_Rb_tree_iterator<std::pair<const_unsigned_int,_const_void_*>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_unsigned_int,_const_void_*>_> *)
               in_stack_fffffffffffffa90);
    local_c8._M_node =
         (_Base_ptr)
         std::
         map<_cl_mem_*,_CLIntercept::SImageInfo,_std::less<_cl_mem_*>,_std::allocator<std::pair<_cl_mem_*const,_CLIntercept::SImageInfo>_>_>
         ::find((map<_cl_mem_*,_CLIntercept::SImageInfo,_std::less<_cl_mem_*>,_std::allocator<std::pair<_cl_mem_*const,_CLIntercept::SImageInfo>_>_>
                 *)in_stack_fffffffffffffa88,(key_type *)0x2110fc);
    local_d0._M_node =
         (_Base_ptr)
         std::
         map<_cl_mem_*,_CLIntercept::SImageInfo,_std::less<_cl_mem_*>,_std::allocator<std::pair<_cl_mem_*const,_CLIntercept::SImageInfo>_>_>
         ::end((map<_cl_mem_*,_CLIntercept::SImageInfo,_std::less<_cl_mem_*>,_std::allocator<std::pair<_cl_mem_*const,_CLIntercept::SImageInfo>_>_>
                *)in_stack_fffffffffffffa88);
    bVar3 = std::operator!=(&local_c8,&local_d0);
    if (bVar3) {
      local_d8 = std::
                 map<_cl_mem_*,_CLIntercept::SImageInfo,_std::less<_cl_mem_*>,_std::allocator<std::pair<_cl_mem_*const,_CLIntercept::SImageInfo>_>_>
                 ::operator[]((map<_cl_mem_*,_CLIntercept::SImageInfo,_std::less<_cl_mem_*>,_std::allocator<std::pair<_cl_mem_*const,_CLIntercept::SImageInfo>_>_>
                               *)in_stack_fffffffffffffad0,(key_type *)in_stack_fffffffffffffac8);
      local_e8 = local_c0;
      pmVar7 = std::
               map<const_void_*,_unsigned_int,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_int>_>_>
               ::operator[]((map<const_void_*,_unsigned_int,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_int>_>_>
                             *)in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
      local_dc = *pmVar7;
      std::__cxx11::string::string(local_108,local_60);
      snprintf(local_208,0x100,"%04u",local_10 & 0xffffffff);
      std::__cxx11::string::operator+=(local_108,"Enqueue_");
      std::__cxx11::string::operator+=(local_108,local_208);
      std::__cxx11::string::operator+=(local_108,"_Kernel_");
      getShortKernelName_abi_cxx11_(in_stack_fffffffffffffad8,(cl_kernel)in_stack_fffffffffffffad0);
      std::__cxx11::string::operator+=(local_108,local_228);
      std::__cxx11::string::~string(local_228);
      snprintf(local_208,0x100,"%u",(ulong)local_b4);
      std::__cxx11::string::operator+=(local_108,"_Arg_");
      std::__cxx11::string::operator+=(local_108,local_208);
      snprintf(local_208,0x100,"%04u",(ulong)local_dc);
      std::__cxx11::string::operator+=(local_108,"_Image_");
      std::__cxx11::string::operator+=(local_108,local_208);
      in_stack_fffffffffffffa88 =
           (map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>
            *)(local_d8->ElementSize << 3);
      snprintf(local_208,0x100,"_%zux%zux%zu_%zubpp",local_d8->Region[0],local_d8->Region[1],
               local_d8->Region[2]);
      std::__cxx11::string::operator+=(local_108,local_208);
      std::__cxx11::string::operator+=(local_108,".raw");
      std::ifstream::ifstream(local_430);
      _Var5 = std::__cxx11::string::c_str();
      std::operator|(_S_in,_S_bin);
      std::ifstream::open(local_430,_Var5);
      bVar4 = std::ios::good();
      if ((bVar4 & 1) != 0) {
        std::operator+((char *)in_stack_fffffffffffffad8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffad0);
        __x = (double)std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98
                                                ),(char *)in_stack_fffffffffffffa90);
        log(in_RDI,__x);
        std::__cxx11::string::~string(local_450);
        std::__cxx11::string::~string(local_470);
        local_478 = (CLIntercept *)0x0;
        std::istream::seekg((long)local_430,_S_beg);
        auVar10 = std::istream::tellg();
        local_488 = auVar10;
        in_stack_fffffffffffffad8 =
             (CLIntercept *)std::fpos::operator_cast_to_long((fpos *)local_488);
        local_478 = in_stack_fffffffffffffad8;
        __x_00 = (float)std::istream::seekg((long)local_430,_S_beg);
        local_490 = (CLIntercept *)
                    (local_d8->Region[0] * local_d8->Region[1] * local_d8->Region[2] *
                    local_d8->ElementSize);
        if (local_490 == local_478) {
          pCVar8 = (CLIntercept *)std::vector<char,_std::allocator<char>_>::size(&local_40);
          if (pCVar8 < local_490) {
            std::vector<char,_std::allocator<char>_>::resize
                      (in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
          }
        }
        else {
          logf(in_RDI,__x_00);
        }
        pCVar8 = (CLIntercept *)std::vector<char,_std::allocator<char>_>::size(&local_40);
        if (local_490 <= pCVar8) {
          pcVar9 = std::vector<char,_std::allocator<char>_>::data
                             ((vector<char,_std::allocator<char>_> *)0x2116e7);
          std::istream::read(local_430,(long)pcVar9);
          local_4a8 = 0;
          uStack_4a0 = 0;
          local_498 = 0;
          in_stack_fffffffffffffad0 = dispatch(in_RDI);
          pvVar2 = local_c0;
          pmVar1 = local_d8;
          in_stack_fffffffffffffac8 = (key_type *)in_stack_fffffffffffffad0->clEnqueueWriteImage;
          in_stack_fffffffffffffab0 = local_20;
          in_stack_fffffffffffffa90 =
               (lock_guard<std::mutex> *)
               std::vector<char,_std::allocator<char>_>::data
                         ((vector<char,_std::allocator<char>_> *)0x211771);
          in_stack_fffffffffffffaa8 = 0;
          in_stack_fffffffffffffaa0 = (vector<char,_std::allocator<char>_> *)0x0;
          in_stack_fffffffffffffa98 = 0;
          in_stack_fffffffffffffa88 =
               (map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>
                *)0x0;
          (*(code *)in_stack_fffffffffffffac8)
                    (in_stack_fffffffffffffab0,pvVar2,1,&local_4a8,pmVar1,0);
        }
      }
      std::ifstream::~ifstream(local_430);
      std::__cxx11::string::~string(local_108);
    }
  }
  std::__cxx11::string::~string(local_60);
  std::vector<char,_std::allocator<char>_>::~vector(in_stack_fffffffffffffaa0);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x21182b);
  return;
}

Assistant:

void CLIntercept::injectImagesForKernel(
    const uint64_t enqueueCounter,
    cl_kernel kernel,
    cl_command_queue command_queue )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    std::vector<char>   transferBuf;
    std::string prefix;

    OS().GetDumpDirectoryNameWithoutPid( sc_DumpDirectoryName, prefix );
    prefix += "/Inject/";

    CArgMemMap& kernelArgMemMap = m_KernelArgMemMap[ kernel ];
    CArgMemMap::iterator  i = kernelArgMemMap.begin();
    while( i != kernelArgMemMap.end() )
    {
        CLI_C_ASSERT( sizeof(void*) == sizeof(cl_mem) );

        cl_uint arg_index = (*i).first;
        cl_mem  memobj = (cl_mem)(*i).second;

        ++i;

        if( m_ImageInfoMap.find( memobj ) != m_ImageInfoMap.end() )
        {
            const SImageInfo&   info = m_ImageInfoMap[ memobj ];
            unsigned int        number = m_MemAllocNumberMap[ memobj ];

            std::string fileName( prefix );
            char    tmpStr[ MAX_PATH ];

            // Add the enqueue count to file name
            {
                CLI_SPRINTF( tmpStr, MAX_PATH, "%04u",
                    (unsigned int)enqueueCounter );

                fileName += "Enqueue_";
                fileName += tmpStr;
            }

            // Add the kernel name to the file name
            {
                fileName += "_Kernel_";
                fileName += getShortKernelName(kernel);
            }

            // Add the arg number to the file name
            {
                CLI_SPRINTF( tmpStr, MAX_PATH, "%u", arg_index );

                fileName += "_Arg_";
                fileName += tmpStr;
            }

            // Add the image number to the file name
            {
                CLI_SPRINTF( tmpStr, MAX_PATH, "%04u", number );

                fileName += "_Image_";
                fileName += tmpStr;
            }

            // Add the image dimensions to the file name
            {
                CLI_SPRINTF( tmpStr, MAX_PATH, "_%zux%zux%zu_%zubpp",
                    info.Region[0],
                    info.Region[1],
                    info.Region[2],
                    info.ElementSize * 8 );

                fileName += tmpStr;
            }

            // Add extension to file name
            {
                fileName += ".raw";
            }

            std::ifstream is;
            is.open( fileName.c_str(), std::ios::in | std::ios::binary );
            if( is.good() )
            {
                log("Injecting image file: " + fileName + "\n");

                size_t  fileSize = 0;
                is.seekg( 0, std::ios::end );
                fileSize = (size_t)is.tellg();
                is.seekg( 0, std::ios::beg );

                size_t  size =
                    info.Region[0] *
                    info.Region[1] *
                    info.Region[2] *
                    info.ElementSize;

                if( size != fileSize )
                {
                    logf("Skipping injection: image size (%zu bytes) is not equal to file size (%zu bytes)!\n",
                        size, fileSize );
                }
                else if( transferBuf.size() < size )
                {
                    transferBuf.resize(size);
                }

                if( transferBuf.size() >= size )
                {
                    is.read( (char*)transferBuf.data(), size );

                    size_t  origin[3] = { 0, 0, 0 };
                    dispatch().clEnqueueWriteImage(
                        command_queue,
                        memobj,
                        CL_TRUE,
                        origin,
                        info.Region,
                        0,
                        0,
                        transferBuf.data(),
                        0,
                        NULL,
                        NULL );
                }
            }
        }
    }
}